

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pragmaVtabCursorClear(PragmaVtabCursor *pCsr)

{
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = (sqlite3_stmt *)0x0;
  sqlite3_free(pCsr->azArg[0]);
  pCsr->azArg[0] = (char *)0x0;
  sqlite3_free(pCsr->azArg[1]);
  pCsr->azArg[1] = (char *)0x0;
  return;
}

Assistant:

static void pragmaVtabCursorClear(PragmaVtabCursor *pCsr){
  int i;
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = 0;
  for(i=0; i<ArraySize(pCsr->azArg); i++){
    sqlite3_free(pCsr->azArg[i]);
    pCsr->azArg[i] = 0;
  }
}